

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl.c
# Opt level: O2

int uv__dlerror(uv_lib_t *lib)

{
  char *pcVar1;
  int iVar2;
  
  uv__free(lib->errmsg);
  pcVar1 = (char *)dlerror();
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
    iVar2 = 0;
  }
  else {
    pcVar1 = uv__strdup(pcVar1);
    iVar2 = -1;
  }
  lib->errmsg = pcVar1;
  return iVar2;
}

Assistant:

static int uv__dlerror(uv_lib_t* lib) {
  const char* errmsg;

  uv__free(lib->errmsg);

  errmsg = dlerror();

  if (errmsg) {
    lib->errmsg = uv__strdup(errmsg);
    return -1;
  }
  else {
    lib->errmsg = NULL;
    return 0;
  }
}